

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall GLFWGraphicsContext::GLFWGraphicsContext(GLFWGraphicsContext *this)

{
  int iVar1;
  runtime_error *this_00;
  GLFWwindow *pGVar2;
  ostream *poVar3;
  uchar *puVar4;
  uchar *puVar5;
  GraphicsContext *in_RDI;
  GLubyte *version;
  GLubyte *renderer;
  GLFWwindow *window;
  GLFWwindow *in_stack_00000330;
  GLFWmonitor *in_stack_00000338;
  char *in_stack_00000340;
  int in_stack_00000348;
  int in_stack_0000034c;
  GLFWwindow *in_stack_ffffffffffffff70;
  
  GraphicsContext::GraphicsContext(in_RDI);
  in_RDI->_vptr_GraphicsContext = (_func_int **)&PTR__GLFWGraphicsContext_002595b0;
  in_RDI[1]._vptr_GraphicsContext = (_func_int **)0x0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Could not initialize glfw");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  setGlfwFlags();
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
  pGVar2 = glfwCreateWindow(in_stack_0000034c,in_stack_00000348,in_stack_00000340,in_stack_00000338,
                            in_stack_00000330);
  glfwMakeContextCurrent(in_stack_ffffffffffffff70);
  glfwSwapInterval((int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  glewExperimental = '\x01';
  glewInit();
  if (__GLEW_VERSION_4_1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"glew didn\'t init properly");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if (__glewProgramParameteri == (PFNGLPROGRAMPARAMETERIPROC)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"glew didn\'t init properly");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  puVar4 = (uchar *)glGetString(0x1f01);
  puVar5 = (uchar *)glGetString(0x1f02);
  poVar3 = std::operator<<((ostream *)&std::cout,"OpenGL Renderer: ");
  poVar3 = std::operator<<(poVar3,puVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"OpenGL Version: ");
  poVar3 = std::operator<<(poVar3,puVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  in_RDI[1]._vptr_GraphicsContext = (_func_int **)pGVar2;
  glfwMakeContextCurrent((GLFWwindow *)poVar3);
  return;
}

Assistant:

GLFWGraphicsContext()
    {
        glfwSetErrorCallback(error_callback);
        if (!glfwInit())
            throw std::runtime_error("Could not initialize glfw");

        setGlfwFlags();
        glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

        GLFWwindow* window = glfwCreateWindow(16, 16, "Root graphics context", NULL, NULL);
        glfwMakeContextCurrent(window);
        glfwSwapInterval(1); // must be set when a window's context is current

        glewExperimental = GL_TRUE;
        glewInit(); // create GLEW after the context has been created

        if (!GLEW_VERSION_4_1)
            std::cerr << "glew didn't init properly" << std::endl;

        if (!glProgramParameteri)
            std::cerr << "glew didn't init properly" << std::endl;

        // get version info
        const GLubyte* renderer = glGetString(GL_RENDERER); // get renderer string
        const GLubyte* version = glGetString(GL_VERSION); // version as a string
        std::cout << "OpenGL Renderer: " << renderer << std::endl;
        std::cout << "OpenGL Version: " << version << std::endl;

        _window = window;

        // the context should only be captured when it's in use, as it can't be
        // captured in two places at once
        glfwMakeContextCurrent(nullptr);
    }